

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

CURLcode curl_global_trace(char *config)

{
  undefined8 *puVar1;
  int iVar2;
  CURLcode CVar3;
  char *__s;
  char *first;
  undefined4 uVar4;
  long lVar5;
  char *pcStack_38;
  
  __s = (*Curl_cstrdup)(config);
  if (__s == (char *)0x0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    first = strtok_r(__s,", ",&pcStack_38);
    while (first != (char *)0x0) {
      uVar4 = 1;
      if (*first == '+') {
        first = first + 1;
      }
      else if (*first == '-') {
        first = first + 1;
        uVar4 = 0;
      }
      lVar5 = 0;
      do {
        iVar2 = curl_strequal(first,"all");
        puVar1 = *(undefined8 **)((long)cf_types + lVar5);
        if (iVar2 == 0) {
          iVar2 = curl_strequal(first,(char *)*puVar1);
          if (iVar2 != 0) {
            *(undefined4 *)((long)puVar1 + 0xc) = uVar4;
            break;
          }
        }
        else {
          *(undefined4 *)((long)puVar1 + 0xc) = uVar4;
        }
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0x78);
      first = strtok_r((char *)0x0,", ",&pcStack_38);
    }
    (*Curl_cfree)(__s);
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

CURLcode curl_global_trace(const char *config)
{
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  CURLcode result;
  global_init_lock();

  result = Curl_trc_opt(config);

  global_init_unlock();

  return result;
#else
  (void)config;
  return CURLE_OK;
#endif
}